

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall UnitTestBasehello5::Run(UnitTestBasehello5 *this)

{
  bool bVar1;
  UnitTestBase *pUVar2;
  allocator local_cc;
  allocator local_cb;
  allocator local_ca;
  allocator local_c9;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  Regex r;
  
  bert::Regex::Regex(&r,"(a|b|c)*b*");
  bVar1 = bert::Regex::Match(&r,"b");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_68,"\'r.Match(\"b\")\'",&local_c9);
    pUVar2 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_68,true,false);
  }
  else {
    std::__cxx11::string::string((string *)&local_68,"\'r.Match(\"b\")\'",&local_c9);
    pUVar2 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_68,false,false);
  }
  UnitTestBase::FlushError(pUVar2);
  std::__cxx11::string::~string((string *)&local_68);
  bVar1 = bert::Regex::Match(&r,"bbb");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_88,"\'r.Match(\"bbb\")\'",&local_ca);
    pUVar2 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_88,true,false);
  }
  else {
    std::__cxx11::string::string((string *)&local_88,"\'r.Match(\"bbb\")\'",&local_ca);
    pUVar2 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_88,false,false);
  }
  UnitTestBase::FlushError(pUVar2);
  std::__cxx11::string::~string((string *)&local_88);
  bVar1 = bert::Regex::Match(&r,"bbbabc");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_a8,"\'r.Match(\"bbbabc\")\'",&local_cb);
    pUVar2 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_a8,true,false);
  }
  else {
    std::__cxx11::string::string((string *)&local_a8,"\'r.Match(\"bbbabc\")\'",&local_cb);
    pUVar2 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_a8,false,false);
  }
  UnitTestBase::FlushError(pUVar2);
  std::__cxx11::string::~string((string *)&local_a8);
  bVar1 = bert::Regex::Match(&r,"");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_c8,"\'r.Match(\"\")\'",&local_cc);
    pUVar2 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_c8,true,false);
  }
  else {
    std::__cxx11::string::string((string *)&local_c8,"\'r.Match(\"\")\'",&local_cc);
    pUVar2 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_c8,false,false);
  }
  UnitTestBase::FlushError(pUVar2);
  std::__cxx11::string::~string((string *)&local_c8);
  bert::Regex::~Regex(&r);
  return;
}

Assistant:

TEST_CASE(hello5)
{
    Regex r("(a|b|c)*b*");

    EXPECT_TRUE(r.Match("b"));
    EXPECT_TRUE(r.Match("bbb"));
    EXPECT_TRUE(r.Match("bbbabc"));
    EXPECT_TRUE(r.Match(""));
}